

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hulog.cpp
# Opt level: O1

void log_event(int event,void *ptr,size_t size)

{
  map<void_*,_hu_allocinfo_s,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
  *pmVar1;
  bool bVar2;
  _Rb_tree_color _Var3;
  int callstack_depth;
  mapped_type *__dest;
  _Rb_tree_header *p_Var4;
  FILE *__stream;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  pair<std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>,_std::_Rb_tree_iterator<std::pair<void_*const,_hu_allocinfo_s>_>_>
  pVar7;
  hu_allocinfo_t allocinfo;
  void *local_190;
  void *local_188;
  size_t local_180;
  undefined1 local_178 [160];
  undefined4 local_d8;
  undefined4 local_2c;
  
  pmVar1 = freed_allocations;
  if (logging_enabled != 0) {
    local_190 = ptr;
    if (event == 2) {
      p_Var4 = &(allocations->_M_t)._M_impl.super__Rb_tree_header;
      p_Var6 = (allocations->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var5 = &p_Var4->_M_header;
      for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(void **)(p_Var6 + 1) < ptr]) {
        if (*(void **)(p_Var6 + 1) >= ptr) {
          p_Var5 = p_Var6;
        }
      }
      p_Var6 = &p_Var4->_M_header;
      if (((_Rb_tree_header *)p_Var5 != p_Var4) && (p_Var6 = p_Var5, ptr < *(void **)(p_Var5 + 1)))
      {
        p_Var6 = &p_Var4->_M_header;
      }
      if ((_Rb_tree_header *)p_Var6 == p_Var4) {
        if (hu_log_free != 0) {
          p_Var4 = &(freed_allocations->_M_t)._M_impl.super__Rb_tree_header;
          p_Var6 = (freed_allocations->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var5 = &p_Var4->_M_header;
          for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[*(void **)(p_Var6 + 1) < ptr]
              ) {
            if (*(void **)(p_Var6 + 1) >= ptr) {
              p_Var5 = p_Var6;
            }
          }
          p_Var6 = &p_Var4->_M_header;
          if (((_Rb_tree_header *)p_Var5 != p_Var4) &&
             (p_Var6 = p_Var5, ptr < *(void **)(p_Var5 + 1))) {
            p_Var6 = &p_Var4->_M_header;
          }
          if ((_Rb_tree_header *)p_Var6 != p_Var4) {
            callstack_depth = backtrace(&local_188,0x14);
            bVar2 = log_is_valid_callstack(callstack_depth,&local_188,false);
            if ((bVar2) && (__stream = fopen(hu_log_file,"a"), __stream != (FILE *)0x0)) {
              fprintf(__stream,"==%d== Invalid deallocation at:\n",(ulong)(uint)pid);
              log_print_callstack((FILE *)__stream,callstack_depth,&local_188);
              fprintf(__stream,"==%d==  Address %p is a block of size %ld free\'d at:\n",
                      (ulong)(uint)pid,local_190,p_Var6[1]._M_left);
              log_print_callstack((FILE *)__stream,p_Var6[0xc]._M_color,(void **)(p_Var6 + 7));
              fprintf(__stream,"==%d==  Block was alloc\'d at:\n",(ulong)(uint)pid);
              log_print_callstack((FILE *)__stream,*(int *)&p_Var6[6]._M_right,&p_Var6[1]._M_right);
              fprintf(__stream,"==%d== \n",(ulong)(uint)pid);
              fclose(__stream);
            }
          }
        }
      }
      else {
        allocinfo_current_alloc_bytes = allocinfo_current_alloc_bytes - (long)p_Var6[1]._M_left;
        if ((hu_useafterfree) || (hu_log_free != 0)) {
          _Var3 = backtrace(p_Var6 + 7,0x14);
          p_Var6[0xc]._M_color = _Var3;
          std::
          _Rb_tree<void*,std::pair<void*const,hu_allocinfo_s>,std::_Select1st<std::pair<void*const,hu_allocinfo_s>>,std::less<void*>,std::allocator<std::pair<void*const,hu_allocinfo_s>>>
          ::_M_emplace_unique<std::pair<void*const,hu_allocinfo_s>&>
                    ((_Rb_tree<void*,std::pair<void*const,hu_allocinfo_s>,std::_Select1st<std::pair<void*const,hu_allocinfo_s>>,std::less<void*>,std::allocator<std::pair<void*const,hu_allocinfo_s>>>
                      *)freed_allocations,(pair<void_*const,_hu_allocinfo_s> *)(p_Var6 + 1));
        }
        pmVar1 = allocations;
        pVar7 = std::
                _Rb_tree<void_*,_std::pair<void_*const,_hu_allocinfo_s>,_std::_Select1st<std::pair<void_*const,_hu_allocinfo_s>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
                ::equal_range(&allocations->_M_t,&local_190);
        std::
        _Rb_tree<void_*,_std::pair<void_*const,_hu_allocinfo_s>,_std::_Select1st<std::pair<void_*const,_hu_allocinfo_s>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
        ::_M_erase_aux(&pmVar1->_M_t,(_Base_ptr)pVar7.first._M_node,(_Base_ptr)pVar7.second._M_node)
        ;
      }
      allocinfo_total_frees = allocinfo_total_frees + 1;
    }
    else if (event == 1) {
      if (hu_log_free != 0) {
        pVar7 = std::
                _Rb_tree<void_*,_std::pair<void_*const,_hu_allocinfo_s>,_std::_Select1st<std::pair<void_*const,_hu_allocinfo_s>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
                ::equal_range(&freed_allocations->_M_t,&local_190);
        std::
        _Rb_tree<void_*,_std::pair<void_*const,_hu_allocinfo_s>,_std::_Select1st<std::pair<void_*const,_hu_allocinfo_s>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
        ::_M_erase_aux(&pmVar1->_M_t,(_Base_ptr)pVar7.first._M_node,(_Base_ptr)pVar7.second._M_node)
        ;
      }
      if (hu_log_minleak <= size) {
        local_188 = local_190;
        local_180 = size;
        local_d8 = backtrace(local_178,0x14);
        local_2c = 1;
        __dest = std::
                 map<void_*,_hu_allocinfo_s,_std::less<void_*>,_std::allocator<std::pair<void_*const,_hu_allocinfo_s>_>_>
                 ::operator[](allocations,&local_190);
        memcpy(__dest,&local_188,0x160);
        allocinfo_total_allocs = allocinfo_total_allocs + 1;
        allocinfo_total_alloc_bytes = allocinfo_total_alloc_bytes + size;
        allocinfo_current_alloc_bytes = size + allocinfo_current_alloc_bytes;
        if (allocinfo_peak_alloc_bytes < allocinfo_current_alloc_bytes) {
          allocinfo_peak_alloc_bytes = allocinfo_current_alloc_bytes;
        }
      }
    }
  }
  return;
}

Assistant:

void log_event(int event, void *ptr, size_t size)
{
  if (logging_enabled)
  {
    if (event == EVENT_MALLOC)
    {
      if (hu_log_free)
      {
        freed_allocations->erase(ptr);
      }
      
      if (size >= hu_log_minleak)
      {
        hu_allocinfo_t allocinfo;
        allocinfo.size = size;
        allocinfo.ptr = ptr;
        allocinfo.callstack_depth = backtrace(allocinfo.callstack, MAX_CALL_STACK);
        allocinfo.count = 1;
        (*allocations)[ptr] = allocinfo;
        
        allocinfo_total_allocs += 1;
        allocinfo_total_alloc_bytes += size;
        allocinfo_current_alloc_bytes += size;

        if (allocinfo_current_alloc_bytes > allocinfo_peak_alloc_bytes)
        {
          allocinfo_peak_alloc_bytes = allocinfo_current_alloc_bytes;
        }
      }
    }
      else if (event == EVENT_FREE)
      {
        std::map<void*, hu_allocinfo_t>::iterator allocation = allocations->find(ptr);
        if (allocation != allocations->end())
        {
          allocinfo_current_alloc_bytes -= allocation->second.size;

          if (hu_useafterfree || hu_log_free)
          {
            allocation->second.free_callstack_depth =
              backtrace(allocation->second.free_callstack, MAX_CALL_STACK);
            freed_allocations->insert(*allocation);
          }
          
          allocations->erase(ptr);
        }
        else if (hu_log_free)
        {
          allocation = freed_allocations->find(ptr);
          if (allocation != freed_allocations->end())
          {
            void *callstack[MAX_CALL_STACK];
            int callstack_depth = backtrace(callstack, MAX_CALL_STACK);
            if (log_is_valid_callstack(callstack_depth, callstack, false))
            {
              FILE *f = fopen(hu_log_file, "a");
              if (f)
              {
                fprintf(f, "==%d== Invalid deallocation at:\n", pid);

                log_print_callstack(f, callstack_depth, callstack);

                fprintf(f, "==%d==  Address %p is a block of size %ld free'd at:\n",
                        pid, ptr, allocation->second.size);
          
                log_print_callstack(f, allocation->second.free_callstack_depth,
                                    allocation->second.free_callstack);

                fprintf(f, "==%d==  Block was alloc'd at:\n", pid);
          
                log_print_callstack(f, allocation->second.callstack_depth,
                                    allocation->second.callstack);

                fprintf(f, "==%d== \n", pid);

                fclose(f);
              }
            }
          }
        }

        allocinfo_total_frees += 1;
      }

  }
}